

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall
leveldb::Block::Iter::Iter
          (Iter *this,Comparator *comparator,char *data,uint32_t restarts,uint32_t num_restarts)

{
  long lVar1;
  undefined4 in_ECX;
  size_type in_RDX;
  size_type in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  Iterator *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Iterator::Iterator(in_stack_ffffffffffffffa8);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__Iter_023cbaf0;
  in_RDI[1]._M_string_length = in_RSI;
  in_RDI[1].field_2._M_allocated_capacity = in_RDX;
  *(undefined4 *)((long)&in_RDI[1].field_2 + 8) = in_ECX;
  *(undefined4 *)((long)&in_RDI[1].field_2 + 0xc) = in_R8D;
  *(undefined4 *)&in_RDI[2]._M_dataplus._M_p = *(undefined4 *)((long)&in_RDI[1].field_2 + 8);
  *(undefined4 *)((long)&in_RDI[2]._M_dataplus._M_p + 4) =
       *(undefined4 *)((long)&in_RDI[1].field_2 + 0xc);
  std::__cxx11::string::string(in_RDI);
  Slice::Slice((Slice *)in_stack_ffffffffffffffa8);
  Status::Status((Status *)in_stack_ffffffffffffffa8);
  if (*(int *)((long)&in_RDI[1].field_2 + 0xc) == 0) {
    __assert_fail("num_restarts_ > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/block.cc"
                  ,0x7c,
                  "leveldb::Block::Iter::Iter(const Comparator *, const char *, uint32_t, uint32_t)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Iter(const Comparator* comparator, const char* data, uint32_t restarts,
       uint32_t num_restarts)
      : comparator_(comparator),
        data_(data),
        restarts_(restarts),
        num_restarts_(num_restarts),
        current_(restarts_),
        restart_index_(num_restarts_) {
    assert(num_restarts_ > 0);
  }